

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_mp_rshift_safe(void)

{
  _func_size_t_size_t *p_Var1;
  mp_int *x_00;
  size_t sVar2;
  mp_int *pmVar3;
  mp_int *r;
  size_t i;
  mp_int *x;
  
  x_00 = mp_random_bits_fn(0x100,random_read);
  r = (mp_int *)0x0;
  while( true ) {
    p_Var1 = looplimit;
    sVar2 = mp_max_bits(x_00);
    pmVar3 = (mp_int *)(*p_Var1)(sVar2 + 1);
    if (pmVar3 <= r) break;
    log_start();
    pmVar3 = mp_rshift_safe(x_00,(size_t)r);
    log_end();
    mp_free(pmVar3);
    r = (mp_int *)((long)&r->nw + 1);
  }
  mp_free(x_00);
  return;
}

Assistant:

static void test_mp_rshift_safe(void)
{
    mp_int *x = mp_random_bits(256);

    for (size_t i = 0; i < looplimit(mp_max_bits(x)+1); i++) {
        log_start();
        mp_int *r = mp_rshift_safe(x, i);
        log_end();
        mp_free(r);
    }

    mp_free(x);
}